

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O0

void __thiscall jrtplib::RTPCollisionList::Clear(RTPCollisionList *this)

{
  RTPAddress *obj;
  bool bVar1;
  reference pAVar2;
  RTPMemoryManager *mgr;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<jrtplib::RTPCollisionList::AddressAndTime> local_18;
  iterator it;
  RTPCollisionList *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
             ::begin(&this->addresslist);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
         ::end(&this->addresslist);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pAVar2 = std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*(&local_18);
    obj = pAVar2->addr;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPAddress>(obj,mgr);
    std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator++(&local_18,0);
  }
  std::__cxx11::
  list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
  ::clear(&this->addresslist);
  return;
}

Assistant:

void RTPCollisionList::Clear()
{
	std::list<AddressAndTime>::iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
		RTPDelete((*it).addr,GetMemoryManager());
	addresslist.clear();
}